

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage>
          (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *this,byte *param_2)

{
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> bVar1;
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> bVar2;
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> bVar3;
  undefined2 uVar4;
  bool_storage temp;
  
  bVar1 = *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)(param_2 + 2);
  uVar4 = *(undefined2 *)param_2;
  bVar2 = *this;
  *param_2 = *param_2 & 0xf0 | (byte)bVar2 & 0xf;
  bVar3 = *this;
  *param_2 = (byte)bVar3 & 0xf0 | (byte)bVar2 & 0xf;
  *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)(param_2 + 1) = this[1];
  memcpy(param_2 + 4,this + 4,(ulong)((byte)*this >> 2 & 0xfffffffc));
  param_2 = param_2 + (ulong)((byte)bVar3 >> 4) * 4 + 4;
  param_2[0] = 0;
  param_2[1] = 0;
  param_2[2] = 0;
  param_2[3] = 0;
  *(undefined2 *)this = uVar4;
  this[2] = bVar1;
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }